

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_f74f::LoadCgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  pointer pIVar6;
  int iVar7;
  int y;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  allocator_type local_69;
  vector<Image,_std::allocator<Image>_> *local_68;
  ulong local_60;
  Image local_50;
  
  uVar12 = (ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 8;
  Image::Image(&local_50,0xf,0xf);
  local_68 = __return_storage_ptr__;
  local_60 = uVar12;
  std::vector<Image,_std::allocator<Image>_>::vector
            (__return_storage_ptr__,uVar12,&local_50,&local_69);
  std::_Vector_base<color_t,_std::allocator<color_t>_>::~_Vector_base
            (&local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>);
  for (uVar12 = 0; uVar12 != local_60; uVar12 = uVar12 + 1) {
    uVar5 = (ulong)(uint)((int)uVar12 << 8) | 4;
    pIVar6 = (local_68->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar12;
    iVar7 = 0;
    for (lVar8 = 1; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      lVar9 = (long)iVar7;
      uVar10 = uVar5;
      for (lVar11 = 3; lVar11 != 0x13; lVar11 = lVar11 + 4) {
        bVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        lVar4 = (ulong)(bVar1 >> 6) * 3;
        lVar3 = (pIVar6->width_ * lVar9 + lVar11) * 3;
        lVar2 = *(long *)&(pIVar6->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data;
        *(undefined1 *)(lVar2 + -7 + lVar3) = (anonymous_namespace)::cga_palette[lVar4 + 2];
        *(undefined2 *)(lVar2 + -9 + lVar3) =
             *(undefined2 *)((anonymous_namespace)::cga_palette + lVar4);
        lVar4 = (ulong)(bVar1 >> 4 & 3) * 3;
        lVar3 = (pIVar6->width_ * lVar9 + lVar11) * 3;
        lVar2 = *(long *)&(pIVar6->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data;
        *(undefined1 *)(lVar2 + -4 + lVar3) = (anonymous_namespace)::cga_palette[lVar4 + 2];
        *(undefined2 *)(lVar2 + -6 + lVar3) =
             *(undefined2 *)((anonymous_namespace)::cga_palette + lVar4);
        lVar4 = (ulong)(bVar1 >> 2 & 3) * 3;
        lVar3 = (pIVar6->width_ * lVar9 + lVar11) * 3;
        lVar2 = *(long *)&(pIVar6->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data;
        *(undefined2 *)(lVar2 + -3 + lVar3) =
             *(undefined2 *)((anonymous_namespace)::cga_palette + lVar4);
        *(undefined1 *)(lVar2 + -1 + lVar3) = (anonymous_namespace)::cga_palette[lVar4 + 2];
        if (lVar11 != 0xf) {
          lVar4 = (ulong)(bVar1 & 3) * 3;
          lVar2 = *(long *)&(pIVar6->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>.
                            _M_impl.super__Vector_impl_data;
          lVar3 = (pIVar6->width_ * lVar9 + lVar11) * 3;
          *(undefined1 *)(lVar2 + 2 + lVar3) = (anonymous_namespace)::cga_palette[lVar4 + 2];
          *(undefined2 *)(lVar2 + lVar3) =
               *(undefined2 *)((anonymous_namespace)::cga_palette + lVar4);
        }
        uVar10 = uVar10 + 1;
      }
      uVar5 = uVar5 + 4;
      iVar7 = iVar7 + 1;
    }
  }
  return local_68;
}

Assistant:

std::vector<Image> LoadCgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images, Image(kImageWidth, kImageHeight));

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    // Ignore first full row (contains garbage)
    for (auto y = 1; y < kCellHeight; ++y) {
      for (auto x = 0; x < kCgaBytesPerRow; ++x) {
        auto const byte_offset = image_offset + (y * kCgaBytesPerRow) + x;
        auto const b = data[byte_offset];

        // (y - 1) to compensate for ignoring the first row
        image.Set(x * kCgaPixelsPerByte, y - 1, cga_palette[HalfNibble(b, 3)]);
        image.Set(x * kCgaPixelsPerByte + 1, y - 1,
                  cga_palette[HalfNibble(b, 2)]);
        image.Set(x * kCgaPixelsPerByte + 2, y - 1,
                  cga_palette[HalfNibble(b, 1)]);

        // Last byte of row only contains 3 pixels (because final image
        // is 15 wide, not 16 wide)
        if (x != kCgaBytesPerRow - 1) {
          image.Set(x * kCgaPixelsPerByte + 3, y - 1,
                    cga_palette[HalfNibble(b, 0)]);
        }
      }
    }
  }

  return images;
}